

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O2

bool __thiscall WellFounded::propagate(WellFounded *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  vec<ConjRule_*> *pvVar5;
  Lit *pLVar6;
  bool *pbVar7;
  ConjRule *pCVar8;
  int *piVar9;
  char *pcVar10;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  bool bVar11;
  bool bVar12;
  vec<ConjRule_*> *pvVar13;
  int **ppiVar14;
  Lit *pLVar15;
  uint i_4;
  vec<int> *pvVar16;
  uint uVar17;
  uint j;
  ulong uVar18;
  uint i_8;
  uint i;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  vec<int> *pvVar22;
  int start;
  vec<int> *local_58;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  int local_48;
  byte local_44;
  vec<Lit> local_40;
  
  for (uVar19 = 0; uVar19 < (this->dead_rules).sz; uVar19 = uVar19 + 1) {
    killSupport(this,(this->rules).data[(uint)(this->dead_rules).data[uVar19]]);
  }
  for (uVar19 = 0; uVar19 < (this->no_support).sz; uVar19 = uVar19 + 1) {
    while( true ) {
      pvVar22 = (this->no_support).data;
      piVar4 = (this->ushead).data;
      uVar17 = piVar4[uVar19];
      if ((int)pvVar22[uVar19].sz <= (int)uVar17) break;
      piVar4[uVar19] = uVar17 + 1;
      uVar17 = pvVar22[uVar19].data[uVar17];
      for (uVar18 = 0; pvVar5 = (this->body_occ_rules).data, uVar18 < pvVar5[uVar17].sz;
          uVar18 = uVar18 + 1) {
        killSupport(this,pvVar5[uVar17].data[uVar18]);
      }
    }
  }
  start = -1;
  pvVar22 = (this->no_support).data;
  piVar4 = (this->pufhead).data;
  uVar19 = 0;
  do {
    uVar21 = uVar19;
    pcVar10 = sat.assigns.data;
    uVar18 = (ulong)(this->no_support).sz;
    if (uVar18 <= uVar21) goto LAB_001a9c3e;
    pvVar16 = pvVar22 + uVar21;
    pLVar6 = (this->lits).data;
    pbVar7 = (this->no_support_bool).data;
    uVar17 = piVar4[uVar21];
    while (uVar1 = start, (int)uVar17 < (int)pvVar16->sz) {
      uVar1 = pvVar16->data[uVar17];
      if ((pbVar7[uVar1] == true) &&
         (uVar2 = pLVar6[uVar1].x, (uVar2 & 1) * 2 + -1 != (int)pcVar10[(uint)((int)uVar2 >> 1)]))
      break;
      uVar17 = uVar17 + 1;
      piVar4[uVar21] = uVar17;
    }
    start = uVar1;
    uVar19 = uVar21 + 1;
  } while (start == -1);
  if (uVar21 < uVar18) {
    pvVar22 = &this->ufset;
    if ((this->ufset).data != (int *)0x0) {
      pvVar22->sz = 0;
    }
    vec<int>::push(pvVar22,&start);
    (this->ufset_bool).data[(uint)start] = true;
    if ((this->nfset).data != (int *)0x0) {
      (this->nfset).sz = 0;
    }
    uVar18 = 0;
    local_58 = pvVar22;
    for (uVar19 = 0; pvVar22 = local_58, uVar19 < local_58->sz; uVar19 = uVar19 + 1) {
      uVar17 = (this->ufset).data[uVar19];
      uVar21 = (ulong)uVar17;
      if ((this->no_support_bool).data[uVar21] != true) {
        fprintf(_stderr,"not no_support %d!\n",uVar21);
        for (uVar20 = 0; uVar20 < local_58->sz; uVar20 = uVar20 + 1) {
          fprintf(_stderr,"%d ",(ulong)(uint)(this->ufset).data[uVar20]);
        }
        fprintf(_stderr,"- %d %d\n",uVar19 & 0xffffffff,(ulong)uVar17);
      }
      for (uVar20 = 0; pvVar5 = (this->head_occ_rules).data, uVar20 < pvVar5[uVar21].sz;
          uVar20 = uVar20 + 1) {
        pCVar8 = pvVar5[uVar21].data[uVar20];
        bVar11 = ConjRule::isFalse(pCVar8);
        if (!bVar11) {
          pCVar8->w = pCVar8->sz + -1;
          bVar11 = propRule(this,pCVar8);
          if (bVar11) break;
        }
      }
      while ((int)uVar18 < (int)(this->nfset).sz) {
        uVar17 = (this->nfset).data[uVar18];
        for (uVar21 = 0; pvVar5 = (this->watches).data, pvVar13 = pvVar5 + uVar17,
            uVar21 < pvVar5[uVar17].sz; uVar21 = uVar21 + 1) {
          pCVar8 = pvVar13->data[uVar21];
          if (((this->no_support_bool).data[(uint)pCVar8->head] == true) &&
             (bVar11 = ConjRule::isFalse(pCVar8), !bVar11)) {
            pCVar8->w = pCVar8->w + -1;
            propRule(this,pCVar8);
          }
        }
        uVar18 = (ulong)((int)uVar18 + 1);
        if (pvVar13->data != (ConjRule **)0x0) {
          pvVar13->sz = 0;
        }
      }
    }
    this->index = 0;
    piVar4 = (this->indices).data;
    piVar9 = (this->lowlink).data;
    for (uVar19 = 0; uVar19 < (this->indices).sz; uVar19 = uVar19 + 1) {
      piVar4[uVar19] = -1;
      piVar9[uVar19] = -1;
    }
    vec<vec<int>_>::clear(&this->sccs,false);
    for (uVar19 = 0; uVar19 < pvVar22->sz; uVar19 = uVar19 + 1) {
      uVar17 = (this->ufset).data[uVar19];
      if (((this->no_support_bool).data[uVar17] == true) && ((this->indices).data[uVar17] == -1)) {
        strongconnect(this,uVar17,getDynamicEdges);
      }
    }
    vec<Lit>::vec(&local_40,1);
    for (uVar19 = 0; uVar17 = local_40.sz, uVar19 < pvVar22->sz; uVar19 = uVar19 + 1) {
      piVar4 = (this->ufset).data;
      uVar18 = (ulong)(uint)piVar4[uVar19];
      (this->ufset_bool).data[uVar18] = false;
      pvVar5 = (this->watches).data;
      if (pvVar5[uVar18].data != (ConjRule **)0x0) {
        pvVar5[uVar18].sz = 0;
        uVar18 = (ulong)(uint)piVar4[uVar19];
      }
      if ((this->no_support_bool).data[uVar18] == true) {
        for (uVar21 = 0; pvVar5 = (this->head_occ_rules).data, uVar21 < pvVar5[uVar18].sz;
            uVar21 = uVar21 + 1) {
          pCVar8 = pvVar5[uVar18].data[uVar21];
          bVar11 = ConjRule::isFalse(pCVar8);
          if (bVar11) {
            vec<Lit>::push(&local_40,&pCVar8->body_lit);
          }
        }
      }
      pvVar22 = local_58;
    }
    local_50._pt = (Clause *)malloc((long)(int)local_40.sz * 4 + 8);
    *(uint *)local_50._pt = uVar17 << 8 | 2;
    vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_50._pt);
    r = local_50;
    for (uVar19 = 1; pLVar6 = local_40.data, uVar19 < local_40.sz; uVar19 = uVar19 + 1) {
      pLVar15 = Clause::operator[](r._pt,(int)uVar19);
      pLVar15->x = pLVar6[uVar19].x;
    }
    for (uVar19 = 0; bVar11 = local_58->sz <= uVar19, !bVar11; uVar19 = uVar19 + 1) {
      uVar17 = (this->ufset).data[uVar19];
      if ((this->no_support_bool).data[uVar17] == true) {
        iVar3 = (this->lits).data[uVar17].x;
        local_50._pt = (Clause *)&PTR_finished_001efbb8;
        local_48 = iVar3 >> 1;
        local_44 = (byte)iVar3 & 1;
        bVar12 = BoolView::setVal((BoolView *)&local_50,false,(Reason)r);
        if (!bVar12) goto LAB_001a9ec5;
        (this->no_support_bool).data[uVar17] = false;
      }
    }
    local_50 = (anon_union_8_2_743a5d44_for_Reason_0)this;
    vec<Propagator_*>::push
              (engine.p_queue.data + (uint)(this->super_Propagator).priority,
               (Propagator **)&local_50._pt);
LAB_001a9ec5:
    free(local_40.data);
  }
  else {
LAB_001a9c3e:
    piVar4 = (this->ushead).data;
    piVar9 = (this->pufhead).data;
    ppiVar14 = &((this->no_support).data)->data;
    for (uVar19 = 0; uVar19 < (this->no_support).sz; uVar19 = uVar19 + 1) {
      if (*ppiVar14 != (int *)0x0) {
        ((vec<int> *)(ppiVar14 + -1))->sz = 0;
      }
      piVar4[uVar19] = 0;
      piVar9[uVar19] = 0;
      ppiVar14 = ppiVar14 + 2;
    }
    bVar11 = true;
  }
  return bVar11;
}

Assistant:

bool propagate() override {
		// find all unsupported
		if (DEBUG) {
			printf("propagating\n");
		}

		for (unsigned int i = 0; i < dead_rules.size(); i++) {
			killSupport(rules[dead_rules[i]]);
		}

		for (unsigned int i = 0; i < no_support.size(); i++) {
			while (ushead[i] < static_cast<int>(no_support[i].size())) {
				const int x = no_support[i][ushead[i]++];
				for (unsigned int j = 0; j < body_occ_rules[x].size(); j++) {
					killSupport(body_occ_rules[x][j]);
				}
			}
		}

		if (DEBUG) {
			printf("Decision level: %d\n", engine.decisionLevel());
		}

		if (DEBUG) {
			printf("No support: ");
		}
		if (DEBUG) {
			for (unsigned int i = 0; i < no_support.size(); i++) {
				for (unsigned int j = 0; j < no_support[i].size(); j++) {
					printf("%d, ", no_support[i][j]);
				}
			}
		}
		if (DEBUG) {
			printf("\n");
		}

		int start = -1;
		// pick one to start building unfounded set
		for (unsigned int i = 0; i < no_support.size(); i++) {
			for (; pufhead[i] < static_cast<int>(no_support[i].size()); pufhead[i]++) {
				const int x = no_support[i][pufhead[i]];
				if (no_support_bool[x] && !BoolView(lits[x]).isFalse()) {
					start = x;
					break;
				}
			}
			if (start != -1) {
				break;
			}
		}

		// if all processed, we're done
		if (start == -1) {
			if (DEBUG) {
				printf("all done\n");
			}
			for (unsigned int i = 0; i < no_support.size(); i++) {
				no_support[i].clear();
				ushead[i] = 0;
				pufhead[i] = 0;
			}
			return true;
		}

		// start building unfounded set

		ufset.clear();
		ufset.push(start);
		ufset_bool[start] = true;

		if (DEBUG) {
			printf("starting with %d\n", start);
		}

		nfset.clear();
		int nfshead = 0;

		for (unsigned int uf = 0; uf < ufset.size(); uf++) {
			const int h = ufset[uf];
			if (!no_support_bool[h]) {
				fprintf(stderr, "not no_support %d!\n", h);
				for (unsigned int k = 0; k < ufset.size(); k++) {
					fprintf(stderr, "%d ", ufset[k]);
				}
				fprintf(stderr, "- %d %d\n", uf, h);
			}
			assert(no_support_bool[h]);
			// add rules with h as head
			for (unsigned int i = 0; i < head_occ_rules[h].size(); i++) {
				if (DEBUG) {
					printf("checking %dth rule for %d\n", i, h);
				}
				ConjRule* r = head_occ_rules[h][i];
				if (r->isFalse()) {
					continue;
				}
				r->w = r->sz - 1;
				if (DEBUG) {
					printf("proping rule\n");
				}
				if (propRule(*r)) {
					break;
				}
			}

			// propagate nfset

			while (nfshead < static_cast<int>(nfset.size())) {
				const int x = nfset[nfshead++];
				for (unsigned int i = 0; i < watches[x].size(); i++) {
					ConjRule* r = watches[x][i];
					// if head already founded by another rule, ignore
					if (!no_support_bool[r->head]) {
						continue;
					}
					if (r->isFalse()) {
						continue;
					}
					r->w--;
					propRule(*r);
				}
				watches[x].clear();
			}
		}

		// we have now found an unfounded set! i.e., everything in ufset which is still not justified

		// if empty, should jump straight back up!

		// calc dynamic SCC
		//		fprintf(stderr, "calc Dyn SCC\n");

		index = 0;
		assert(S.size() == 0);
		for (unsigned int i = 0; i < indices.size(); i++) {
			indices[i] = -1;
			lowlink[i] = -1;
		}
		sccs.clear();

		for (unsigned int i = 0; i < ufset.size(); i++) {
			const int h = ufset[i];
			if (!no_support_bool[h]) {
				continue;
			}
			if (indices[h] != -1) {
				continue;
			}
			//			fprintf(stderr, "root %d ", h);
			strongconnect(h, &getDynamicEdges);
		}

		assert(S.size() == 0);

		//		if (sccs.size() > 0) fprintf(stderr, "d %d ", sccs.size());

		// create an explanation

		vec<Lit> ps(1);

		for (unsigned int i = 0; i < ufset.size(); i++) {
			ufset_bool[ufset[i]] = false;
			watches[ufset[i]].clear();
			const int h = ufset[i];
			if (!no_support_bool[h]) {
				continue;
			}
			for (unsigned int i = 0; i < head_occ_rules[h].size(); i++) {
				ConjRule* r = head_occ_rules[h][i];
				if (r->isFalse()) {
					ps.push(r->body_lit);
				}
			}
		}

		Clause* expl = Reason_new(ps.size());
		for (unsigned int i = 1; i < ps.size(); i++) {
			(*expl)[i] = ps[i];
		}
		for (unsigned int i = 0; i < ufset.size(); i++) {
			const int h = ufset[i];
			if (!no_support_bool[h]) {
				continue;
			}
			if (DEBUG) {
				printf("making %d false\n", h);
			}
			if (ADD_CLAUSES) {
				ps[0] = ~lits[h];
				sat.addClause(*Clause_new(ps, false), false);
			}
			assert(!BoolView(lits[h]).isFalse());
			if (!BoolView(lits[h]).setVal(false, expl)) {
				return false;
			}
			no_support_bool[h] = false;
		}

		if (DEBUG) {
			printf("reawaken\n");
		}

		// reawaken, this is not quite correct
		engine.p_queue[priority].push(this);

		return true;
	}